

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  TargetType targetType;
  string *args;
  string *name;
  string sStack_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  TargetLinkLanguage(&local_a8,this,config);
  local_58.View_._M_len = local_a8._M_string_length;
  local_58.View_._M_str = local_a8._M_dataplus._M_p;
  local_88.View_._M_len = 1;
  local_88.View_._M_str = "_";
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  args = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&sStack_c8,name);
  cmStrCat<std::__cxx11::string,char[17],std::__cxx11::string,char[2],std::__cxx11::string>
            (__return_storage_ptr__,&local_58,&local_88,args,(char (*) [17])"_DEVICE_LINKER__",
             &sStack_c8,(char (*) [2])0x5da287,config);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_",
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()),
    "_DEVICE_LINKER__",
    cmGlobalNinjaGenerator::EncodeRuleName(
      this->GetGeneratorTarget()->GetName()),
    "_", config);
}